

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilBitMatrix.c
# Opt level: O0

int Extra_BitMatrixIsClique(Extra_BitMat_t *pMat)

{
  int iVar1;
  int iVar2;
  int local_24;
  int local_20;
  int i;
  int u;
  int v;
  Extra_BitMat_t *pMat_local;
  
  i = 0;
  do {
    local_20 = i;
    if (pMat->nSize <= i) {
      return 1;
    }
    while (local_20 = local_20 + 1, local_20 < pMat->nSize) {
      iVar1 = Extra_BitMatrixLookup1(pMat,i,local_20);
      if (iVar1 != 0) {
        for (local_24 = 0; local_24 < pMat->nSize; local_24 = local_24 + 1) {
          if ((local_24 != i) && (local_24 != local_20)) {
            iVar1 = Extra_BitMatrixLookup1(pMat,local_24,i);
            iVar2 = Extra_BitMatrixLookup1(pMat,local_24,local_20);
            if (iVar1 != iVar2) {
              return 0;
            }
          }
        }
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

int Extra_BitMatrixIsClique( Extra_BitMat_t * pMat )
{
    int v, u, i;
    for ( v = 0; v < pMat->nSize; v++ )
    for ( u = v+1; u < pMat->nSize; u++ )
    {
        if ( !Extra_BitMatrixLookup1( pMat, v, u ) )
            continue;
        // v and u are symmetric
        for ( i = 0; i < pMat->nSize; i++ )
        {
            if ( i == v || i == u )
                continue;
            // i is neither v nor u
            // the symmetry status of i is the same w.r.t. to v and u
            if ( Extra_BitMatrixLookup1( pMat, i, v ) != Extra_BitMatrixLookup1( pMat, i, u ) )
                return 0;
        }
    }
    return 1;
}